

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O1

void __thiscall
google::protobuf::strings::UncheckedArrayByteSink::Append
          (UncheckedArrayByteSink *this,char *data,size_t n)

{
  char *pcVar1;
  LogMessage *pLVar2;
  LogMessage local_68;
  LogFinisher local_29;
  
  pcVar1 = this->dest_;
  if (pcVar1 != data) {
    if (data < pcVar1 + n && pcVar1 <= data) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/bytestream.cc"
                 ,0x3d);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: !(dest_ <= data && data < (dest_ + n)): ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,"Append() data[] overlaps with dest_[]");
      internal::LogFinisher::operator=(&local_29,pLVar2);
      internal::LogMessage::~LogMessage(&local_68);
    }
    memcpy(this->dest_,data,n);
  }
  this->dest_ = this->dest_ + n;
  return;
}

Assistant:

void UncheckedArrayByteSink::Append(const char* data, size_t n) {
  if (data != dest_) {
    // Catch cases where the pointer returned by GetAppendBuffer() was modified.
    GOOGLE_DCHECK(!(dest_ <= data && data < (dest_ + n)))
        << "Append() data[] overlaps with dest_[]";
    memcpy(dest_, data, n);
  }
  dest_ += n;
}